

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STObject.cpp
# Opt level: O2

bool jbcoin::STObject::equivalentSTObject(STObject *obj1,STObject *obj2)

{
  STBase *pSVar1;
  STBase *pSVar2;
  int iVar3;
  int iVar4;
  pointer ppSVar5;
  pointer ppSVar6;
  bool bVar7;
  vector<const_jbcoin::STBase_*,_std::allocator<const_jbcoin::STBase_*>_> sf2;
  vector<const_jbcoin::STBase_*,_std::allocator<const_jbcoin::STBase_*>_> sf1;
  _Vector_base<const_jbcoin::STBase_*,_std::allocator<const_jbcoin::STBase_*>_> local_60;
  _Vector_base<const_jbcoin::STBase_*,_std::allocator<const_jbcoin::STBase_*>_> local_48;
  
  getSortedFields((vector<const_jbcoin::STBase_*,_std::allocator<const_jbcoin::STBase_*>_> *)
                  &local_48,obj1);
  getSortedFields((vector<const_jbcoin::STBase_*,_std::allocator<const_jbcoin::STBase_*>_> *)
                  &local_60,obj2);
  ppSVar5 = local_48._M_impl.super__Vector_impl_data._M_start;
  ppSVar6 = local_60._M_impl.super__Vector_impl_data._M_start;
  if ((long)local_48._M_impl.super__Vector_impl_data._M_finish -
      (long)local_48._M_impl.super__Vector_impl_data._M_start ==
      (long)local_60._M_impl.super__Vector_impl_data._M_finish -
      (long)local_60._M_impl.super__Vector_impl_data._M_start) {
    for (; bVar7 = ppSVar5 == local_48._M_impl.super__Vector_impl_data._M_finish, !bVar7;
        ppSVar5 = ppSVar5 + 1) {
      pSVar1 = *ppSVar5;
      pSVar2 = *ppSVar6;
      iVar3 = (*pSVar1->_vptr_STBase[4])(pSVar1);
      iVar4 = (*pSVar2->_vptr_STBase[4])(pSVar2);
      if (iVar3 != iVar4) break;
      iVar3 = (*pSVar1->_vptr_STBase[9])(pSVar1,pSVar2);
      if ((char)iVar3 == '\0') break;
      ppSVar6 = ppSVar6 + 1;
    }
  }
  else {
    bVar7 = false;
  }
  std::_Vector_base<const_jbcoin::STBase_*,_std::allocator<const_jbcoin::STBase_*>_>::~_Vector_base
            (&local_60);
  std::_Vector_base<const_jbcoin::STBase_*,_std::allocator<const_jbcoin::STBase_*>_>::~_Vector_base
            (&local_48);
  return bVar7;
}

Assistant:

bool STObject::equivalentSTObject (STObject const& obj1, STObject const& obj2)
{
    auto sf1 = getSortedFields (obj1);
    auto sf2 = getSortedFields (obj2);

    return std::equal (sf1.begin (), sf1.end (), sf2.begin (), sf2.end (),
        [] (STBase const* st1, STBase const* st2)
        {
            return (st1->getSType() == st2->getSType()) &&
                st1->isEquivalent (*st2);
        });
}